

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,float *value)

{
  bool bVar1;
  ostream *poVar2;
  value_type_conflict6 *pvVar3;
  from_chars_result_t<char> fVar4;
  string value_str;
  expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  flt;
  float result;
  float v;
  string local_1f8;
  anon_union_32_2_293c120a_for_storage_t_impl<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
  local_1d8;
  byte local_1b8;
  value_type_conflict6 local_1b0 [8];
  unexpected_type<const_char_*> local_190 [47];
  
  bVar1 = MaybeNonFinite<float>(this,(float *)local_190);
  if (bVar1) {
    *value = local_190[0].m_error._0_4_;
    return true;
  }
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  local_1f8._M_string_length = 0;
  local_1f8.field_2._M_local_buf[0] = '\0';
  bVar1 = LexFloat(this,&local_1f8);
  if (!bVar1) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    poVar2 = ::std::operator<<((ostream *)local_190,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-basetype.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ReadBasicType");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xb0b);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_190,"Failed to lex floating value literal.");
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::stringbuf::str();
    PushError(this,&local_1d8.m_error);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
    bVar1 = false;
    goto LAB_002bbe84;
  }
  fVar4 = fast_float::from_chars_advanced<float,char>
                    (local_1f8._M_dataplus._M_p,
                     local_1f8._M_dataplus._M_p + local_1f8._M_string_length,local_1b0,
                     (parse_options_t<char>)0x2e00000005);
  if (fVar4.ec == 0) {
    local_1b8 = 1;
    local_1d8.m_value = local_1b0[0];
LAB_002bbe65:
    pvVar3 = nonstd::expected_lite::
             expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value((expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1d8.m_error);
    *value = *pvVar3;
    bVar1 = true;
  }
  else {
    local_190[0].m_error = "Parse failed.";
    nonstd::expected_lite::
    expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>
              ((expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_1d8.m_error,local_190);
    if ((local_1b8 & 1) != 0) goto LAB_002bbe65;
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    poVar2 = ::std::operator<<((ostream *)local_190,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-basetype.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ReadBasicType");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xb12);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_190,"Failed to parse floating value.");
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::stringbuf::str();
    PushError(this,(string *)local_1b0);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
    bVar1 = false;
  }
  nonstd::expected_lite::
  expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~expected((expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_1d8.m_error);
LAB_002bbe84:
  ::std::__cxx11::string::_M_dispose();
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(float *value) {
  // -inf, inf, nan
  {
    float v;
    if (MaybeNonFinite(&v)) {
      (*value) = v;
      return true;
    }
  }

  std::string value_str;
  if (!LexFloat(&value_str)) {
    PUSH_ERROR_AND_RETURN("Failed to lex floating value literal.");
  }

  auto flt = ParseFloat(value_str);
  if (flt) {
    (*value) = flt.value();
  } else {
    PUSH_ERROR_AND_RETURN("Failed to parse floating value.");
  }

  return true;
}